

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

size_t Assimp::Write<aiMatrix4x4t<float>>(IOStream *stream,aiMatrix4x4 *m)

{
  float *pfVar1;
  long lVar2;
  uint i;
  uint p_iIndex;
  
  for (p_iIndex = 0; p_iIndex != 4; p_iIndex = p_iIndex + 1) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      pfVar1 = aiMatrix4x4t<float>::operator[](m,p_iIndex);
      (*stream->_vptr_IOStream[3])(stream,(long)pfVar1 + lVar2,4,1);
    }
  }
  return 0x40;
}

Assistant:

inline
size_t Write<aiMatrix4x4>(IOStream * stream, const aiMatrix4x4& m) {
    for (unsigned int i = 0; i < 4;++i) {
        for (unsigned int i2 = 0; i2 < 4;++i2) {
            Write<float>(stream,m[i][i2]);
        }
    }

    return 64;
}